

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O0

char * printContainer(SResource *res,char *container,char *restype,char *mimetype,char *id,
                     UErrorCode *status)

{
  FileStream *pFVar1;
  char *pcVar2;
  size_t sVar3;
  UnicodeString local_118;
  UnicodeString local_d8;
  UnicodeString local_88;
  char *local_48;
  char *sid;
  char *resname;
  UErrorCode *status_local;
  char *id_local;
  char *mimetype_local;
  char *restype_local;
  char *container_local;
  SResource *res_local;
  
  sid = (char *)0x0;
  local_48 = (char *)0x0;
  resname = (char *)status;
  status_local = (UErrorCode *)id;
  id_local = mimetype;
  mimetype_local = restype;
  restype_local = container;
  container_local = (char *)res;
  write_tabs(out);
  sid = SResource::getKeyString((SResource *)container_local,srBundle);
  if ((sid == (char *)0x0) || (*sid == '\0')) {
    local_48 = getID((char *)status_local,(char *)0x0,local_48);
  }
  else {
    local_48 = getID((char *)status_local,sid,local_48);
  }
  pFVar1 = out;
  icu_63::UnicodeString::UnicodeString(&local_88,"<");
  write_utf8_file(pFVar1,&local_88);
  icu_63::UnicodeString::~UnicodeString(&local_88);
  pFVar1 = out;
  icu_63::UnicodeString::UnicodeString(&local_d8,restype_local);
  write_utf8_file(pFVar1,&local_d8);
  icu_63::UnicodeString::~UnicodeString(&local_d8);
  pcVar2 = local_48;
  sVar3 = strlen(local_48);
  printAttribute("id",pcVar2,(int32_t)sVar3);
  pcVar2 = sid;
  if (sid != (char *)0x0) {
    sVar3 = strlen(sid);
    printAttribute("resname",pcVar2,(int32_t)sVar3);
  }
  pcVar2 = id_local;
  if (id_local != (char *)0x0) {
    sVar3 = strlen(id_local);
    printAttribute("mime-type",pcVar2,(int32_t)sVar3);
  }
  pcVar2 = mimetype_local;
  if (mimetype_local != (char *)0x0) {
    sVar3 = strlen(mimetype_local);
    printAttribute("restype",pcVar2,(int32_t)sVar3);
  }
  pFVar1 = out;
  tabCount = tabCount + 1;
  if (*(int *)(container_local + 0x30) < 1) {
    icu_63::UnicodeString::UnicodeString(&local_118,">\n");
    write_utf8_file(pFVar1,&local_118);
    icu_63::UnicodeString::~UnicodeString(&local_118);
  }
  else {
    printComments((UString *)(container_local + 0x28),sid,'\x01',(UErrorCode *)resname);
  }
  return local_48;
}

Assistant:

static char *printContainer(SResource *res, const char *container, const char *restype, const char *mimetype, const char *id, UErrorCode *status)
{
    const char *resname = NULL;
    char *sid = NULL;

    write_tabs(out);

    resname = res->getKeyString(srBundle);
    if (resname != NULL && *resname != 0) {
        sid = getID(id, resname, sid);
    } else {
        sid = getID(id, NULL, sid);
    }

    write_utf8_file(out, UnicodeString("<"));
    write_utf8_file(out, UnicodeString(container));
    printAttribute("id", sid, (int32_t) uprv_strlen(sid));

    if (resname != NULL) {
        printAttribute("resname", resname, (int32_t) uprv_strlen(resname));
    }

    if (mimetype != NULL) {
        printAttribute("mime-type", mimetype, (int32_t) uprv_strlen(mimetype));
    }

    if (restype != NULL) {
        printAttribute("restype", restype, (int32_t) uprv_strlen(restype));
    }

    tabCount += 1;
    if (res->fComment.fLength > 0) {
        /* printComments will print the closing ">\n" */
        printComments(&res->fComment, resname, TRUE, status);
    } else {
        write_utf8_file(out, UnicodeString(">\n"));
    }

    return sid;
}